

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QRegion __thiscall QRegion::intersected(QRegion *this,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  QRect *in_RDX;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  piVar5 = *(int **)(*(long *)r + 8);
  if ((piVar5 != (int *)0x0) && (*piVar5 != 0)) {
    iVar1 = (in_RDX->x1).m_i;
    iVar2 = (in_RDX->y1).m_i;
    iVar3 = (in_RDX->x2).m_i;
    iVar4 = (in_RDX->y2).m_i;
    if (((iVar2 <= iVar4 && iVar1 <= iVar3) &&
        (((iVar1 <= piVar5[10] && (piVar5[8] <= iVar3)) && (iVar2 <= piVar5[0xb])))) &&
       (piVar5[9] <= iVar4)) {
      if ((iVar4 < piVar5[0xb] || iVar3 < piVar5[10]) || (piVar5[9] < iVar2 || piVar5[8] < iVar1)) {
        if (((iVar1 < piVar5[0xc]) || (piVar5[0xe] < iVar3)) ||
           ((iVar2 < piVar5[0xd] || (piVar5[0xf] < iVar4)))) {
          if (*piVar5 == 1) {
            auVar8 = QRect::normalized();
            local_38._0_8_ = ZEXT48((uint)piVar5[8]);
            if (piVar5[8] <= auVar8._0_4_) {
              local_38._0_8_ = auVar8._0_8_ & 0xffffffff;
            }
            local_38._8_8_ = ZEXT48((uint)piVar5[10]);
            if (auVar8._8_4_ <= piVar5[10]) {
              local_38._8_8_ = auVar8._8_8_ & 0xffffffff;
            }
            uVar6 = auVar8._0_8_ >> 0x20;
            if (auVar8._4_4_ < piVar5[9]) {
              uVar6 = (ulong)(uint)piVar5[9];
            }
            uVar7 = auVar8._8_8_ >> 0x20;
            if (piVar5[0xb] < auVar8._12_4_) {
              uVar7 = (ulong)(uint)piVar5[0xb];
            }
            local_38._0_8_ = local_38._0_8_ | uVar6 << 0x20;
            local_38._8_8_ = local_38._8_8_ | uVar7 << 0x20;
            QRegion(this,&local_38,Rectangle);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              return (QRegion)(QRegionData *)this;
            }
          }
          else {
            this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion(this,(QRegion *)r);
            detach(this);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              QRegionPrivate::intersect(this->d->qt_rgn,in_RDX);
              return (QRegion)(QRegionData *)this;
            }
          }
        }
        else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QRegion(this,in_RDX,Rectangle);
          return (QRegion)(QRegionData *)this;
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QRegion(this,(QRegion *)r);
        return (QRegion)(QRegionData *)this;
      }
      goto LAB_0042aa1a;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QRegion(this);
    return (QRegion)(QRegionData *)this;
  }
LAB_0042aa1a:
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::intersected(const QRect &r) const
{
    if (isEmptyHelper(d->qt_rgn) || r.isEmpty()
        || !EXTENTCHECK(&d->qt_rgn->extents, &r))
        return QRegion();

    /* this is fully contained in r */
    if (d->qt_rgn->within(r))
        return *this;

    /* r is fully contained in this */
    if (d->qt_rgn->contains(r))
        return r;

    if (d->qt_rgn->numRects == 1) {
        const QRect rect = qt_rect_intersect_normalized(d->qt_rgn->extents,
                                                        r.normalized());
        return QRegion(rect);
    }

    QRegion result(*this);
    result.detach();
    result.d->qt_rgn->intersect(r);
    return result;
}